

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O2

int Gia_ShowAddOut(Vec_Int_t *vAdds,Vec_Int_t *vMapAdds,int Node)

{
  int iVar1;
  
  iVar1 = Vec_IntEntry(vMapAdds,Node);
  if (-1 < iVar1) {
    iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
    return iVar1;
  }
  return Node;
}

Assistant:

int Gia_ShowAddOut( Vec_Int_t * vAdds, Vec_Int_t * vMapAdds, int Node )
{
    int iBox = Vec_IntEntry( vMapAdds, Node );
    if ( iBox >= 0 )
        return Vec_IntEntry( vAdds, 6*iBox+4 );
    return Node;
}